

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crash_example.cc
# Opt level: O3

void thread_sample(SimpleLogger *ll,size_t id)

{
  string local_30;
  
  if ((ll != (SimpleLogger *)0x0) && (3 < (ll->curLogLevel).super___atomic_base<int>._M_i)) {
    SimpleLogger::put(ll,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/greensky00[P]simple_logger/example/crash_example.cc"
                      ,"thread_sample",9,"new thread, wait %zu seconds",5);
  }
  switch(id) {
  case 0:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    TestSuite::sleep_sec(5,&local_30);
    break;
  case 1:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    TestSuite::sleep_sec(5,&local_30);
    break;
  case 2:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    TestSuite::sleep_sec(5,&local_30);
    break;
  case 3:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    TestSuite::sleep_sec(5,&local_30);
    break;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    TestSuite::sleep_sec(5,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void thread_sample(SimpleLogger* ll, size_t id) {
    size_t sec = 5;
    _log_info(ll, "new thread, wait %zu seconds", sec);
    switch (id) {
    case 0:
        TestSuite::sleep_sec(sec);
        break;
    case 1:
        TestSuite::sleep_sec(sec);
        break;
    case 2:
        TestSuite::sleep_sec(sec);
        break;
    case 3:
        TestSuite::sleep_sec(sec);
        break;
    default:
        TestSuite::sleep_sec(sec);
        break;
    }
}